

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLException.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLException::XMLException(XMLException *this,XMLException *toCopy)

{
  MemoryManager *manager;
  XMLCh *pXVar1;
  char *pcVar2;
  
  this->_vptr_XMLException = (_func_int **)&PTR__XMLException_003fb168;
  this->fCode = toCopy->fCode;
  this->fSrcFile = (char *)0x0;
  this->fSrcLine = toCopy->fSrcLine;
  pXVar1 = XMLString::replicate(toCopy->fMsg,toCopy->fMemoryManager);
  this->fMsg = pXVar1;
  manager = toCopy->fMemoryManager;
  this->fMemoryManager = manager;
  if (toCopy->fSrcFile != (char *)0x0) {
    pcVar2 = XMLString::replicate(toCopy->fSrcFile,manager);
    this->fSrcFile = pcVar2;
  }
  return;
}

Assistant:

XMLException::XMLException(const XMLException& toCopy) :
    XMemory(toCopy)
    , fCode(toCopy.fCode)
    , fSrcFile(0)
    , fSrcLine(toCopy.fSrcLine)
    , fMsg(XMLString::replicate(toCopy.fMsg, toCopy.fMemoryManager))
    , fMemoryManager(toCopy.fMemoryManager)
{
    if (toCopy.fSrcFile) {
        fSrcFile = XMLString::replicate
        (
            toCopy.fSrcFile
            , fMemoryManager
        );
    }
}